

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

bool ImGui::TableSetColumnIndex(int column_n)

{
  ImGuiTable *table_00;
  bool bVar1;
  ImGuiTable *table;
  ImGuiContext *g;
  int column_n_local;
  
  table_00 = GImGui->CurrentTable;
  if (table_00 == (ImGuiTable *)0x0) {
    g._7_1_ = false;
  }
  else {
    if (table_00->CurrentColumn != column_n) {
      if (table_00->CurrentColumn != -1) {
        TableEndCell(table_00);
      }
      bVar1 = false;
      if (-1 < column_n) {
        bVar1 = table_00->ColumnsCount != 0;
      }
      if (!bVar1) {
        __assert_fail("column_n >= 0 && table->ColumnsCount",
                      "/workspace/llm4binary/github/license_c_cmakelists/mgerdes[P]Open-Golf/src/3rd_party/cimgui/imgui/imgui_tables.cpp"
                      ,0x764,"bool ImGui::TableSetColumnIndex(int)");
      }
      TableBeginCell(table_00,column_n);
    }
    g._7_1_ = (table_00->RequestOutputMaskByIndex & 1L << ((byte)column_n & 0x3f)) != 0;
  }
  return g._7_1_;
}

Assistant:

bool ImGui::TableSetColumnIndex(int column_n)
{
    ImGuiContext& g = *GImGui;
    ImGuiTable* table = g.CurrentTable;
    if (!table)
        return false;

    if (table->CurrentColumn != column_n)
    {
        if (table->CurrentColumn != -1)
            TableEndCell(table);
        IM_ASSERT(column_n >= 0 && table->ColumnsCount);
        TableBeginCell(table, column_n);
    }

    // Return whether the column is visible. User may choose to skip submitting items based on this return value,
    // however they shouldn't skip submitting for columns that may have the tallest contribution to row height.
    return (table->RequestOutputMaskByIndex & ((ImU64)1 << column_n)) != 0;
}